

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O3

void __thiscall btHingeConstraint::buildJacobian(btHingeConstraint *this)

{
  undefined8 uVar1;
  btRigidBody *pbVar2;
  btRigidBody *pbVar3;
  long lVar4;
  btJacobianEntry *this_00;
  float fVar5;
  btScalar angle;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  btMatrix3x3 local_128;
  btVector3 jointAxis0;
  btVector3 hingeAxisWorld;
  btMatrix3x3 local_88;
  btVector3 jointAxis1;
  
  if (this->m_useSolveConstraintObsolete == true) {
    (this->super_btTypedConstraint).m_appliedImpulse = 0.0;
    this->m_accMotorImpulse = 0.0;
    if (this->m_angularOnly == false) {
      pbVar2 = (this->super_btTypedConstraint).m_rbA;
      pbVar3 = (this->super_btTypedConstraint).m_rbB;
      fVar5 = (this->m_rbAFrame).m_origin.m_floats[1];
      fVar6 = (this->m_rbAFrame).m_origin.m_floats[0];
      fVar7 = (this->m_rbAFrame).m_origin.m_floats[2];
      uVar1 = *(undefined8 *)(pbVar2->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
      fVar14 = fVar7 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                       [2] +
               fVar6 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                       [0] +
               fVar5 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                       [1] + (float)uVar1;
      fVar15 = fVar7 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                       [2] +
               fVar6 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                       [0] +
               fVar5 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                       [1] + (float)((ulong)uVar1 >> 0x20);
      fVar8 = (this->m_rbBFrame).m_origin.m_floats[1];
      fVar11 = (this->m_rbBFrame).m_origin.m_floats[0];
      fVar9 = (this->m_rbBFrame).m_origin.m_floats[2];
      fVar12 = fVar9 * (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                       [2] +
               fVar11 * (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                        [0] +
               fVar8 * (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                       [1] + (pbVar3->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2]
      ;
      fVar13 = fVar7 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                       [2] +
               fVar6 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                       [0] +
               fVar5 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                       [1] + (pbVar2->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2]
      ;
      uVar1 = *(undefined8 *)(pbVar3->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
      fVar10 = fVar9 * (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                       [2] +
               fVar11 * (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                        [0] +
               fVar8 * (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                       [1] + (float)uVar1;
      fVar11 = fVar9 * (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                       [2] +
               fVar11 * (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                        [0] +
               fVar8 * (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                       [1] + (float)((ulong)uVar1 >> 0x20);
      fVar5 = fVar10 - fVar14;
      fVar6 = fVar11 - fVar15;
      fVar7 = fVar12 - fVar13;
      fVar8 = fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6;
      if (fVar8 <= 1.1920929e-07) {
        local_88.m_el[0].m_floats = (btScalar  [4])ZEXT816(0x3f800000);
        fVar6 = 0.0;
        fVar5 = 1.0;
        fVar7 = 0.0;
      }
      else {
        fVar8 = 1.0 / SQRT(fVar8);
        fVar7 = fVar7 * fVar8;
        fVar5 = fVar5 * fVar8;
        fVar6 = fVar6 * fVar8;
        local_88.m_el[0].m_floats[1] = fVar6;
        local_88.m_el[0].m_floats[0] = fVar5;
        local_88.m_el[0].m_floats[2] = fVar7;
        local_88.m_el[0].m_floats[3] = 0.0;
      }
      if (ABS(fVar7) <= 0.70710677) {
        fVar8 = fVar5 * fVar5 + fVar6 * fVar6;
        fVar9 = 1.0 / SQRT(fVar8);
        local_88.m_el[2].m_floats[2] = fVar8 * fVar9;
        local_88.m_el[1].m_floats[1] = fVar9 * fVar5;
        local_88.m_el[1].m_floats[0] = fVar9 * -fVar6;
        fVar8 = -fVar7 * local_88.m_el[1].m_floats[1];
        fVar7 = fVar7 * local_88.m_el[1].m_floats[0];
        local_88.m_el[1].m_floats[2] = 0.0;
      }
      else {
        fVar9 = fVar6 * fVar6 + fVar7 * fVar7;
        fVar8 = 1.0 / SQRT(fVar9);
        local_88.m_el[1].m_floats[1] = -fVar7 * fVar8;
        local_88.m_el[1].m_floats[2] = fVar6 * fVar8;
        fVar8 = fVar8 * fVar9;
        fVar7 = local_88.m_el[1].m_floats[2] * -fVar5;
        local_88.m_el[2].m_floats[2] = fVar5 * local_88.m_el[1].m_floats[1];
        local_88.m_el[1].m_floats[0] = 0.0;
      }
      local_88.m_el[2].m_floats[1] = fVar7;
      local_88.m_el[2].m_floats[0] = fVar8;
      this_00 = this->m_jac;
      lVar4 = 0;
      do {
        pbVar2 = (this->super_btTypedConstraint).m_rbA;
        local_128.m_el[0].m_floats[0] =
             (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
        local_128.m_el[0].m_floats[1] =
             (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
        local_128.m_el[0].m_floats[2] =
             (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
        local_128.m_el[0].m_floats[3] = 0.0;
        local_128.m_el[1].m_floats[0] =
             (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
        local_128.m_el[1].m_floats[1] =
             (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
        local_128.m_el[1].m_floats[2] =
             (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
        local_128.m_el[1].m_floats[3] = 0.0;
        local_128.m_el[2].m_floats[0] =
             (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
        local_128.m_el[2].m_floats[1] =
             (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
        local_128.m_el[2].m_floats[2] =
             (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
        local_128.m_el[2].m_floats[3] = 0.0;
        pbVar3 = (this->super_btTypedConstraint).m_rbB;
        jointAxis0.m_floats[1] =
             (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
        jointAxis0.m_floats[0] =
             (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
        jointAxis0.m_floats[2] =
             (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
        jointAxis0.m_floats[3] = 0.0;
        uVar1 = *(undefined8 *)(pbVar2->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
        jointAxis1.m_floats[1] = fVar15 - (float)((ulong)uVar1 >> 0x20);
        jointAxis1.m_floats[0] = fVar14 - (float)uVar1;
        jointAxis1.m_floats[2] =
             fVar13 - (pbVar2->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
        jointAxis1.m_floats[3] = 0.0;
        uVar1 = *(undefined8 *)(pbVar3->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
        hingeAxisWorld.m_floats[1] = fVar11 - (float)((ulong)uVar1 >> 0x20);
        hingeAxisWorld.m_floats[0] = fVar10 - (float)uVar1;
        hingeAxisWorld.m_floats[2] =
             fVar12 - (pbVar3->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
        hingeAxisWorld.m_floats[3] = 0.0;
        btJacobianEntry::btJacobianEntry
                  (this_00,&local_128,(btMatrix3x3 *)&jointAxis0,&jointAxis1,&hingeAxisWorld,
                   (btVector3 *)((long)local_88.m_el[0].m_floats + lVar4),&pbVar2->m_invInertiaLocal
                   ,pbVar2->m_inverseMass,&pbVar3->m_invInertiaLocal,pbVar3->m_inverseMass);
        lVar4 = lVar4 + 0x10;
        this_00 = this_00 + 1;
      } while (lVar4 != 0x30);
    }
    fVar5 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
    fVar6 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
    fVar7 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
    if (ABS(fVar7) <= 0.70710677) {
      fVar12 = fVar5 * fVar5 + fVar6 * fVar6;
      fVar11 = 1.0 / SQRT(fVar12);
      fVar13 = -fVar6 * fVar11;
      fVar10 = fVar5 * fVar11;
      fVar8 = -fVar7 * fVar10;
      fVar9 = fVar7 * fVar13;
      fVar11 = fVar11 * fVar12;
      fVar12 = 0.0;
    }
    else {
      fVar11 = fVar6 * fVar6 + fVar7 * fVar7;
      fVar8 = 1.0 / SQRT(fVar11);
      fVar10 = -fVar7 * fVar8;
      fVar12 = fVar6 * fVar8;
      fVar8 = fVar8 * fVar11;
      fVar9 = -fVar5 * fVar12;
      fVar11 = fVar5 * fVar10;
      fVar13 = 0.0;
    }
    pbVar2 = (this->super_btTypedConstraint).m_rbA;
    local_88.m_el[0].m_floats[0] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_88.m_el[1].m_floats[0] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_88.m_el[2].m_floats[0] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_88.m_el[0].m_floats[1] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_88.m_el[1].m_floats[1] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_88.m_el[2].m_floats[1] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_88.m_el[0].m_floats[2] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_88.m_el[1].m_floats[2] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_88.m_el[2].m_floats[2] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_88.m_el[0].m_floats[3] = 0.0;
    local_88.m_el[1].m_floats[3] = 0.0;
    jointAxis0.m_floats[1] =
         fVar12 * local_88.m_el[2].m_floats[1] +
         fVar13 * local_88.m_el[0].m_floats[1] + fVar10 * local_88.m_el[1].m_floats[1];
    jointAxis0.m_floats[0] =
         fVar12 * local_88.m_el[2].m_floats[0] +
         fVar13 * local_88.m_el[0].m_floats[0] + fVar10 * local_88.m_el[1].m_floats[0];
    jointAxis0.m_floats[2] =
         fVar12 * local_88.m_el[2].m_floats[2] +
         fVar13 * local_88.m_el[0].m_floats[2] + fVar10 * local_88.m_el[1].m_floats[2];
    jointAxis0.m_floats[3] = 0.0;
    jointAxis1.m_floats[1] =
         fVar11 * local_88.m_el[2].m_floats[1] +
         fVar8 * local_88.m_el[0].m_floats[1] + fVar9 * local_88.m_el[1].m_floats[1];
    jointAxis1.m_floats[0] =
         fVar11 * local_88.m_el[2].m_floats[0] +
         fVar8 * local_88.m_el[0].m_floats[0] + fVar9 * local_88.m_el[1].m_floats[0];
    jointAxis1.m_floats[2] =
         fVar9 * local_88.m_el[1].m_floats[2] + local_88.m_el[0].m_floats[2] * fVar8 +
         local_88.m_el[2].m_floats[2] * fVar11;
    jointAxis1.m_floats[3] = 0.0;
    hingeAxisWorld.m_floats[1] =
         fVar7 * local_88.m_el[2].m_floats[1] +
         fVar5 * local_88.m_el[0].m_floats[1] + fVar6 * local_88.m_el[1].m_floats[1];
    hingeAxisWorld.m_floats[0] =
         fVar7 * local_88.m_el[2].m_floats[0] +
         fVar5 * local_88.m_el[0].m_floats[0] + fVar6 * local_88.m_el[1].m_floats[0];
    hingeAxisWorld.m_floats[2] =
         fVar6 * local_88.m_el[1].m_floats[2] + local_88.m_el[0].m_floats[2] * fVar5 +
         local_88.m_el[2].m_floats[2] * fVar7;
    hingeAxisWorld.m_floats[3] = 0.0;
    local_88.m_el[2].m_floats[3] = 0.0;
    pbVar3 = (this->super_btTypedConstraint).m_rbB;
    local_128.m_el[0].m_floats[0] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_128.m_el[0].m_floats[1] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_128.m_el[0].m_floats[2] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_128.m_el[0].m_floats[3] = 0.0;
    local_128.m_el[1].m_floats[0] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_128.m_el[1].m_floats[1] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_128.m_el[1].m_floats[2] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_128.m_el[1].m_floats[3] = 0.0;
    local_128.m_el[2].m_floats[0] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_128.m_el[2].m_floats[1] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_128.m_el[2].m_floats[2] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_128.m_el[2].m_floats[3] = 0.0;
    btJacobianEntry::btJacobianEntry
              (this->m_jacAng,&jointAxis0,&local_88,&local_128,&pbVar2->m_invInertiaLocal,
               &pbVar3->m_invInertiaLocal);
    pbVar2 = (this->super_btTypedConstraint).m_rbA;
    local_88.m_el[0].m_floats[1] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_88.m_el[0].m_floats[0] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_88.m_el[0].m_floats[2] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_88.m_el[0].m_floats[3] = 0.0;
    local_88.m_el[1].m_floats[0] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_88.m_el[1].m_floats[1] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_88.m_el[1].m_floats[2] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_88.m_el[1].m_floats[3] = 0.0;
    local_88.m_el[2].m_floats[1] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_88.m_el[2].m_floats[0] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_88.m_el[2].m_floats[2] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_88.m_el[2].m_floats[3] = 0.0;
    pbVar3 = (this->super_btTypedConstraint).m_rbB;
    local_128.m_el[0].m_floats[0] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_128.m_el[0].m_floats[1] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_128.m_el[0].m_floats[2] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_128.m_el[0].m_floats[3] = 0.0;
    local_128.m_el[1].m_floats[0] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_128.m_el[1].m_floats[1] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_128.m_el[1].m_floats[2] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_128.m_el[1].m_floats[3] = 0.0;
    local_128.m_el[2].m_floats[0] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_128.m_el[2].m_floats[1] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_128.m_el[2].m_floats[2] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_128.m_el[2].m_floats[3] = 0.0;
    btJacobianEntry::btJacobianEntry
              (this->m_jacAng + 1,&jointAxis1,&local_88,&local_128,&pbVar2->m_invInertiaLocal,
               &pbVar3->m_invInertiaLocal);
    pbVar2 = (this->super_btTypedConstraint).m_rbA;
    local_88.m_el[0].m_floats[1] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_88.m_el[0].m_floats[0] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_88.m_el[0].m_floats[2] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_88.m_el[0].m_floats[3] = 0.0;
    local_88.m_el[1].m_floats[0] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_88.m_el[1].m_floats[1] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_88.m_el[1].m_floats[2] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_88.m_el[1].m_floats[3] = 0.0;
    local_88.m_el[2].m_floats[1] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_88.m_el[2].m_floats[0] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_88.m_el[2].m_floats[2] =
         (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_88.m_el[2].m_floats[3] = 0.0;
    pbVar3 = (this->super_btTypedConstraint).m_rbB;
    local_128.m_el[0].m_floats[0] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
    local_128.m_el[0].m_floats[1] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
    local_128.m_el[0].m_floats[2] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
    local_128.m_el[0].m_floats[3] = 0.0;
    local_128.m_el[1].m_floats[0] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    local_128.m_el[1].m_floats[1] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    local_128.m_el[1].m_floats[2] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    local_128.m_el[1].m_floats[3] = 0.0;
    local_128.m_el[2].m_floats[0] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    local_128.m_el[2].m_floats[1] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    local_128.m_el[2].m_floats[2] =
         (pbVar3->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    local_128.m_el[2].m_floats[3] = 0.0;
    btJacobianEntry::btJacobianEntry
              (this->m_jacAng + 2,&hingeAxisWorld,&local_88,&local_128,&pbVar2->m_invInertiaLocal,
               &pbVar3->m_invInertiaLocal);
    this->m_accLimitImpulse = 0.0;
    angle = getHingeAngle(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                                m_worldTransform,
                          &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                           m_worldTransform);
    this->m_hingeAngle = angle;
    btAngularLimit::test(&this->m_limit,angle);
    fVar5 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
    fVar6 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
    fVar7 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
    pbVar2 = (this->super_btTypedConstraint).m_rbA;
    pbVar3 = (this->super_btTypedConstraint).m_rbB;
    fVar8 = (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] * fVar7 +
            (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] * fVar5 +
            (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1] * fVar6;
    fVar11 = (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] * fVar7
             + (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] *
               fVar5 + (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                       [1] * fVar6;
    fVar5 = fVar7 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] +
            fVar5 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] +
            fVar6 * (pbVar2->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
    this->m_kHinge =
         1.0 / ((*(float *)&pbVar3->field_0x174 * fVar5 +
                *(float *)&pbVar3->field_0x154 * fVar8 + *(float *)&pbVar3->field_0x164 * fVar11) *
                fVar5 + (*(float *)&pbVar3->field_0x16c * fVar5 +
                        *(float *)&(pbVar3->super_btCollisionObject).field_0x14c * fVar8 +
                        *(float *)&pbVar3->field_0x15c * fVar11) * fVar8 +
                        (*(float *)&pbVar3->field_0x170 * fVar5 +
                        *(float *)&pbVar3->field_0x150 * fVar8 +
                        *(float *)&pbVar3->field_0x160 * fVar11) * fVar11 +
               (*(float *)&pbVar2->field_0x174 * fVar5 +
               *(float *)&pbVar2->field_0x154 * fVar8 + *(float *)&pbVar2->field_0x164 * fVar11) *
               fVar5 + (*(float *)&pbVar2->field_0x16c * fVar5 +
                       *(float *)&(pbVar2->super_btCollisionObject).field_0x14c * fVar8 +
                       *(float *)&pbVar2->field_0x15c * fVar11) * fVar8 +
                       (*(float *)&pbVar2->field_0x170 * fVar5 +
                       *(float *)&pbVar2->field_0x150 * fVar8 +
                       *(float *)&pbVar2->field_0x160 * fVar11) * fVar11);
  }
  return;
}

Assistant:

void	btHingeConstraint::buildJacobian()
{
	if (m_useSolveConstraintObsolete)
	{
		m_appliedImpulse = btScalar(0.);
		m_accMotorImpulse = btScalar(0.);

		if (!m_angularOnly)
		{
			btVector3 pivotAInW = m_rbA.getCenterOfMassTransform()*m_rbAFrame.getOrigin();
			btVector3 pivotBInW = m_rbB.getCenterOfMassTransform()*m_rbBFrame.getOrigin();
			btVector3 relPos = pivotBInW - pivotAInW;

			btVector3 normal[3];
			if (relPos.length2() > SIMD_EPSILON)
			{
				normal[0] = relPos.normalized();
			}
			else
			{
				normal[0].setValue(btScalar(1.0),0,0);
			}

			btPlaneSpace1(normal[0], normal[1], normal[2]);

			for (int i=0;i<3;i++)
			{
				new (&m_jac[i]) btJacobianEntry(
				m_rbA.getCenterOfMassTransform().getBasis().transpose(),
				m_rbB.getCenterOfMassTransform().getBasis().transpose(),
				pivotAInW - m_rbA.getCenterOfMassPosition(),
				pivotBInW - m_rbB.getCenterOfMassPosition(),
				normal[i],
				m_rbA.getInvInertiaDiagLocal(),
				m_rbA.getInvMass(),
				m_rbB.getInvInertiaDiagLocal(),
				m_rbB.getInvMass());
			}
		}

		//calculate two perpendicular jointAxis, orthogonal to hingeAxis
		//these two jointAxis require equal angular velocities for both bodies

		//this is unused for now, it's a todo
		btVector3 jointAxis0local;
		btVector3 jointAxis1local;
		
		btPlaneSpace1(m_rbAFrame.getBasis().getColumn(2),jointAxis0local,jointAxis1local);

		btVector3 jointAxis0 = getRigidBodyA().getCenterOfMassTransform().getBasis() * jointAxis0local;
		btVector3 jointAxis1 = getRigidBodyA().getCenterOfMassTransform().getBasis() * jointAxis1local;
		btVector3 hingeAxisWorld = getRigidBodyA().getCenterOfMassTransform().getBasis() * m_rbAFrame.getBasis().getColumn(2);
			
		new (&m_jacAng[0])	btJacobianEntry(jointAxis0,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

		new (&m_jacAng[1])	btJacobianEntry(jointAxis1,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

		new (&m_jacAng[2])	btJacobianEntry(hingeAxisWorld,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

			// clear accumulator
			m_accLimitImpulse = btScalar(0.);

			// test angular limit
			testLimit(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());

		//Compute K = J*W*J' for hinge axis
		btVector3 axisA =  getRigidBodyA().getCenterOfMassTransform().getBasis() *  m_rbAFrame.getBasis().getColumn(2);
		m_kHinge =   1.0f / (getRigidBodyA().computeAngularImpulseDenominator(axisA) +
							 getRigidBodyB().computeAngularImpulseDenominator(axisA));

	}
}